

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_put_test.cc
# Opt level: O0

void __thiscall
IntegrationTest_TestIoPut_Test::~IntegrationTest_TestIoPut_Test
          (IntegrationTest_TestIoPut_Test *this)

{
  IntegrationTest_TestIoPut_Test *this_local;
  
  ~IntegrationTest_TestIoPut_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(IntegrationTest, TestIoPut)
{
	Qiniu_Client client;
	Qiniu_RS_PutPolicy putPolicy;
	Qiniu_RS_GetPolicy getPolicy;
	char *uptoken;
	char *dnBaseUrl;
	char *dnRequest;
	char key[100];
	Qiniu_snprintf(key, 100, "key_%d", rand());

	Qiniu_Client_InitMacAuth(&client, 1024, NULL);
	Qiniu_Client_SetTimeout(&client, 5000);
	Qiniu_Client_SetConnectTimeout(&client, 3000);
	Qiniu_Client_EnableAutoQuery(&client, Qiniu_True);

	Qiniu_Zero(putPolicy);
	putPolicy.scope = Test_bucket;
	uptoken = Qiniu_RS_PutPolicy_Token(&putPolicy, NULL);

	Qiniu_RS_Delete(&client, Test_bucket, key);
	clientIoPutFile(uptoken, key);

	Qiniu_RS_Delete(&client, Test_bucket, key);
	clientIoPutBuffer(uptoken, key);

	Qiniu_Free(uptoken);

	Qiniu_Zero(getPolicy);
	dnBaseUrl = Qiniu_RS_MakeBaseUrl(Test_Domain, key);
	dnRequest = Qiniu_RS_GetPolicy_MakeRequest(&getPolicy, dnBaseUrl, NULL);

	clientIoGet(dnRequest);

	Qiniu_Free(dnRequest);
	Qiniu_Free(dnBaseUrl);

	Qiniu_Client_Cleanup(&client);
}